

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quic_unacked_packet_map.cc
# Opt level: O0

void __thiscall
quic::QuicUnackedPacketMap::AddSentPacket
          (QuicUnackedPacketMap *this,uint16_t packet_number,QuicTime *sent_time,
          QuickPacket *sent_packet)

{
  bool bVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  uint16_t uVar4;
  uint64_t sent_time_00;
  uint16_t sequence_number;
  QuickPacket *sent_packet_local;
  QuicTime *sent_time_local;
  uint16_t packet_number_local;
  QuicUnackedPacketMap *this_local;
  
  uVar2 = QuickPacket::sequence_number(sent_packet);
  if (this->_unack_sequence_numbers[packet_number] != -1) {
    __assert_fail("_unack_sequence_numbers[packet_number] == -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/boss-li[P]quick/congestion_control/quic_unacked_packet_map.cc"
                  ,0x12,
                  "void quic::QuicUnackedPacketMap::AddSentPacket(uint16_t, QuicTime &, QuickPacket *)"
                 );
  }
  this->_unack_sequence_numbers[packet_number] = (uint)uVar2;
  bVar1 = QuickPacket::IsValid((QuickPacket *)(&this->field_0x0 + (ulong)uVar2 * 0x28));
  if (bVar1) {
    uVar4 = QuickPacket::data_len((QuickPacket *)(&this->field_0x0 + (ulong)uVar2 * 0x28));
    uVar3 = QuickPacket::data_len(sent_packet);
    if (uVar4 != uVar3) {
      __assert_fail("_unack_packets[sequence_number].data_len() == sent_packet->data_len()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/boss-li[P]quick/congestion_control/quic_unacked_packet_map.cc"
                    ,0x22,
                    "void quic::QuicUnackedPacketMap::AddSentPacket(uint16_t, QuicTime &, QuickPacket *)"
                   );
    }
  }
  else {
    QuickPacket::WriteData((QuickPacket *)(&this->field_0x0 + (ulong)uVar2 * 0x28),sent_packet);
  }
  uVar4 = QuickPacket::data_len(sent_packet);
  this->_bytes_in_flight = (ulong)uVar4 + this->_bytes_in_flight;
  this->_packets_in_flight = this->_packets_in_flight + 1;
  sent_time_00 = QuicTime::ToDebuggingValue(sent_time);
  QuickPacket::SetSentTime((QuickPacket *)(&this->field_0x0 + (ulong)uVar2 * 0x28),sent_time_00);
  return;
}

Assistant:

void QuicUnackedPacketMap::AddSentPacket(uint16_t packet_number,
		QuicTime &sent_time, 
		QuickPacket* sent_packet)
	{
		uint16_t sequence_number = sent_packet->sequence_number();
		assert(_unack_sequence_numbers[packet_number] == -1);
		_unack_sequence_numbers[packet_number] = sequence_number;

#ifdef OUTPUT_VERBOSE_INFO
			dd::OutputDebugInfo("AddSentPacket set _unack_sequence_numbers[%u] = %u\r\n", packet_number, sequence_number);
#endif

		if (!_unack_packets[sequence_number].IsValid()) {
			_unack_packets[sequence_number].WriteData(sent_packet);
		}
		else {
			// �ش���������Ҫ��д�ڴ�
#ifdef OUTPUT_VERBOSE_INFO
				dd::OutputDebugInfo("cannot write packet, sequence number = %d\r\n",
					sequence_number);
#endif
			assert(_unack_packets[sequence_number].data_len() == sent_packet->data_len());
		}

		_bytes_in_flight += sent_packet->data_len();
		_packets_in_flight++;

#ifdef OUTPUT_VERBOSE_INFO
			dd::OutputDebugInfo("Add  packet sequence number = %d _bytes_in_flight = %llu, new sent len = %d, _packets_in_flight = %llu\r\n",
						sequence_number, _bytes_in_flight, sent_packet->data_len(), _packets_in_flight);
#endif

		_unack_packets[sequence_number].SetSentTime(sent_time.ToDebuggingValue());
	}